

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

tokdfdef * tok_find_define(tokcxdef *ctx,char *sym,int len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  errcxdef *ctx_00;
  tokdfdef *ptVar5;
  
  uVar1 = tokdfhsh(sym,len);
  ptVar5 = (tokdfdef *)(ctx->tokcxdf + uVar1);
  do {
    ptVar5 = ptVar5->nxt;
    if (ptVar5 == (tokdfdef *)0x0) {
      return (tokdfdef *)0x0;
    }
  } while ((ptVar5->len != len) || (iVar2 = bcmp(ptVar5->nm,sym,(long)len), iVar2 != 0));
  if (len == 8) {
    if (*(long *)sym == 0x5f5f454c49465f5f) {
      ptVar5->expan[0] = '\'';
      (*ctx->tokcxlin->linnamp)(ctx->tokcxlin,&ptVar5->field_0x19);
      sVar4 = strlen(ptVar5->expan);
      ptVar5->expan[sVar4] = '\'';
      ptVar5->explen = (int)sVar4 + 1;
      if (0xffe < (int)sVar4) {
        ctx_00 = ctx->tokcxerr;
        iVar2 = 0x7d;
LAB_00115104:
        errsigf(ctx_00,"TADS",iVar2);
      }
    }
    else if (*(long *)sym == 0x5f5f454e494c5f5f) {
      uVar3 = (*ctx->tokcxlin->linlnump)(ctx->tokcxlin);
      sprintf(ptVar5->expan,"%lu",uVar3);
      sVar4 = strlen(ptVar5->expan);
      ptVar5->explen = (int)sVar4;
      if (0x27 < (int)sVar4) {
        ctx_00 = ctx->tokcxerr;
        iVar2 = 0x7e;
        goto LAB_00115104;
      }
    }
  }
  return ptVar5;
}

Assistant:

static tokdfdef *tok_find_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;

    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (df = ctx->tokcxdf[hsh] ; df ; df = df->nxt)
    {
        /* if this one matches, return it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* fix it up if it's the special __FILE__ or __LINE__ symbol */
            if (len == 8)
            {
                if (!memcmp(sym, "__FILE__", (size_t)8))
                {
                    size_t len;

                    /* 
                     *   put in the opening single quote, since we want
                     *   the expanded result to be a string 
                     */
                    df->expan[0] = '\'';

                    /* get the name */
                    linnam(ctx->tokcxlin, df->expan+1);

                    /* get the length, and add the closing quote */
                    len = strlen(df->expan);
                    df->expan[len] = '\'';

                    /* 
                     *   set the length of the expansion, including the
                     *   quotes (the first quote was measured in the
                     *   length originally, but the second quote hasn't
                     *   been counted yet, so add one to our original
                     *   length) 
                     */
                    df->explen = (int)len + 1;

                    /* if the expansion is too long, it's an error */
                    if (df->explen >= OSFNMAX)
                        errsig(ctx->tokcxerr, ERR_LONG_FILE_MACRO);
                }
                else if (!memcmp(sym, "__LINE__", (size_t)8))
                {
                    ulong l;

                    /* get the line number */
                    l = linlnum(ctx->tokcxlin);

                    /* convert it to a textual format for the expansion */
                    sprintf(df->expan, "%lu", l);

                    /* set the expanded value's length */
                    df->explen = strlen(df->expan);

                    /* make sure the expansion isn't too long */
                    if (df->explen >= 40)
                        errsig(ctx->tokcxerr, ERR_LONG_LINE_MACRO);
                }
            }
            
            /* return it */
            return df;
        }
    }

    /* didn't find anything */
    return 0;
}